

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SerializeWithCachedSizes
          (CodeGeneratorRequest *this,CodedOutputStream *output)

{
  int iVar1;
  int size;
  uint uVar2;
  char *pcVar3;
  string *psVar4;
  FileDescriptorProto *value;
  UnknownFieldSet *unknown_fields;
  uint local_48;
  uint n_1;
  uint i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  CodeGeneratorRequest *this_local;
  
  i_1 = 0;
  iVar1 = file_to_generate_size(this);
  for (; (int)i_1 < iVar1; i_1 = i_1 + 1) {
    file_to_generate_abi_cxx11_(this,i_1);
    pcVar3 = (char *)std::__cxx11::string::data();
    file_to_generate_abi_cxx11_(this,i_1);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar3,size,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    psVar4 = file_to_generate_abi_cxx11_(this,i_1);
    internal::WireFormatLite::WriteString(1,psVar4,output);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    parameter_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    parameter_abi_cxx11_(this);
    iVar1 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar3,iVar1,SERIALIZE,"google.protobuf.compiler.CodeGeneratorRequest.parameter");
    psVar4 = parameter_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(2,psVar4,output);
  }
  if ((uVar2 & 2) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray
              (3,(MessageLite *)this->compiler_version_,output);
  }
  local_48 = 0;
  uVar2 = proto_file_size(this);
  for (; local_48 < uVar2; local_48 = local_48 + 1) {
    value = proto_file(this,local_48);
    internal::WireFormatLite::WriteMessageMaybeToArray(0xf,(MessageLite *)value,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = CodeGeneratorRequest::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void CodeGeneratorRequest::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this->file_to_generate_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->file_to_generate(i).data(), this->file_to_generate(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->file_to_generate(i), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional string parameter = 2;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->parameter(), output);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      3, *this->compiler_version_, output);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned int i = 0, n = this->proto_file_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      15, this->proto_file(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.compiler.CodeGeneratorRequest)
}